

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O0

int Saig_ManReadNumber(Aig_Man_t *p,char *pToken)

{
  char *pToken_local;
  Aig_Man_t *p_local;
  
  if (*pToken == 'n') {
    p_local._4_4_ = atoi(pToken + 1);
  }
  else if (*pToken == 'p') {
    p_local._4_4_ = atoi(pToken + 2);
  }
  else {
    if (*pToken != 'l') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIoa.c"
                    ,0xb6,"int Saig_ManReadNumber(Aig_Man_t *, char *)");
    }
    p_local._4_4_ = atoi(pToken + 2);
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManReadNumber( Aig_Man_t * p, char * pToken )
{
    if ( pToken[0] == 'n' )
        return atoi( pToken + 1 );
    if ( pToken[0] == 'p' )
        return atoi( pToken + 2 );
    if ( pToken[0] == 'l' )
        return atoi( pToken + 2 );
    assert( 0 );
    return -1;
}